

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O2

int respond_ok(SOCKINFO *info,int time_out,subscription *sub,http_message_t *request)

{
  uint uVar1;
  int iVar2;
  int upnp_timeout;
  int minor;
  int major;
  membuffer response;
  char local_98 [99];
  undefined1 local_35;
  
  upnp_timeout = 0x1e;
  http_CalcResponseVersion(request->major_version,request->minor_version,&major,&minor);
  if (time_out < 0) {
    local_35 = 0;
    memcpy(local_98,"TIMEOUT: Second-infinite",99);
  }
  else {
    uVar1 = snprintf(local_98,100,"TIMEOUT: Second-%d",time_out);
    if (99 < uVar1) goto LAB_001174e5;
  }
  membuffer_init(&response);
  response.size_inc = 0x1e;
  iVar2 = http_MakeMessage(&response,major,minor,"RDSNXcsscscc",200,0,"redsonic","SID: ",sub,
                           local_98);
  if (iVar2 == 0) {
    iVar2 = http_SendMessage(info,&upnp_timeout,"b",response.buf,response.length);
    membuffer_destroy(&response);
    return iVar2;
  }
  membuffer_destroy(&response);
LAB_001174e5:
  error_respond(info,500,request);
  return -0x68;
}

Assistant:

static int respond_ok(
	/*! [in] Socket connection of request. */
	SOCKINFO *info,
	/*! [in] Accepted duration. */
	int time_out,
	/*! [in] Accepted subscription. */
	subscription *sub,
	/*! [in] Http request. */
	http_message_t *request)
{
	int major;
	int minor;
	membuffer response;
	int return_code;
	char timeout_str[100];
	int upnp_timeout = UPNP_TIMEOUT;
	int rc = 0;

	http_CalcResponseVersion(
		request->major_version, request->minor_version, &major, &minor);

	if (time_out >= 0) {
		rc = snprintf(timeout_str,
			sizeof(timeout_str),
			"TIMEOUT: Second-%d",
			time_out);
	} else {
		memset(timeout_str, 0, sizeof(timeout_str));
		strncpy(timeout_str,
			"TIMEOUT: Second-infinite",
			sizeof(timeout_str) - 1);
	}
	if (rc < 0 || (unsigned int)rc >= sizeof(timeout_str)) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		return UPNP_E_OUTOF_MEMORY;
	}

	membuffer_init(&response);
	response.size_inc = 30;
	if (http_MakeMessage(&response,
		    major,
		    minor,
		    "R"
		    "D"
		    "S"
		    "N"
		    "Xc"
		    "ssc"
		    "scc",
		    HTTP_OK,
		    (off_t)0,
		    X_USER_AGENT,
		    "SID: ",
		    sub->sid,
		    timeout_str) != 0) {
		membuffer_destroy(&response);
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		return UPNP_E_OUTOF_MEMORY;
	}

	return_code = http_SendMessage(
		info, &upnp_timeout, "b", response.buf, response.length);

	membuffer_destroy(&response);

	return return_code;
}